

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeLast(BtCursor *pCur,int *pRes)

{
  BtCursor *in_RSI;
  char *in_RDI;
  int rc;
  int local_1c;
  int local_4;
  
  if ((*in_RDI == '\0') && ((in_RDI[1] & 8U) != 0)) {
    local_4 = 0;
  }
  else {
    local_1c = moveToRoot(in_RSI);
    if (local_1c == 0) {
      in_RSI->eState = '\0';
      in_RSI->curFlags = '\0';
      in_RSI->curPagerFlags = '\0';
      in_RSI->hints = '\0';
      local_1c = moveToRightmost(in_RSI);
      if (local_1c == 0) {
        in_RDI[1] = in_RDI[1] | 8;
      }
      else {
        in_RDI[1] = in_RDI[1] & 0xf7;
      }
    }
    else if (local_1c == 0x10) {
      in_RSI->eState = '\x01';
      in_RSI->curFlags = '\0';
      in_RSI->curPagerFlags = '\0';
      in_RSI->hints = '\0';
      local_1c = 0;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLast(BtCursor *pCur, int *pRes){
  int rc;
 
  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* If the cursor already points to the last entry, this is a no-op. */
  if( CURSOR_VALID==pCur->eState && (pCur->curFlags & BTCF_AtLast)!=0 ){
#ifdef SQLITE_DEBUG
    /* This block serves to assert() that the cursor really does point 
    ** to the last entry in the b-tree. */
    int ii;
    for(ii=0; ii<pCur->iPage; ii++){
      assert( pCur->aiIdx[ii]==pCur->apPage[ii]->nCell );
    }
    assert( pCur->ix==pCur->pPage->nCell-1 );
    assert( pCur->pPage->leaf );
#endif
    return SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    *pRes = 0;
    rc = moveToRightmost(pCur);
    if( rc==SQLITE_OK ){
      pCur->curFlags |= BTCF_AtLast;
    }else{
      pCur->curFlags &= ~BTCF_AtLast;
    }
  }else if( rc==SQLITE_EMPTY ){
    assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
    *pRes = 1;
    rc = SQLITE_OK;
  }
  return rc;
}